

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O1

void Ivy_ManTestCutsTravAll(Ivy_Man_t *p)

{
  Ivy_Obj_t *pObj;
  void *__ptr;
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Vec_Ptr_t *vFront;
  Vec_Int_t *vStore;
  int *piVar3;
  Vec_Vec_t *vBitCuts;
  Vec_Ptr_t *pVVar4;
  long in_RCX;
  long lVar5;
  uint uVar6;
  int level;
  Ivy_Man_t *p_00;
  uint uVar7;
  uint uVar8;
  long local_48;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    local_48 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    in_RCX = -(lVar5 >> 0x3f);
    local_48 = (lVar5 >> 7) + in_RCX + ts.tv_sec * -1000000;
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vNodes->pArray = ppvVar2;
  vFront = (Vec_Ptr_t *)malloc(0x10);
  vFront->nCap = 100;
  vFront->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vFront->pArray = ppvVar2;
  vStore = (Vec_Int_t *)malloc(0x10);
  vStore->nCap = 100;
  vStore->nSize = 0;
  piVar3 = (int *)malloc(400);
  vStore->pArray = piVar3;
  vBitCuts = (Vec_Vec_t *)malloc(0x10);
  vBitCuts->nCap = 100;
  vBitCuts->nSize = 0;
  p_00 = (Ivy_Man_t *)0x320;
  ppvVar2 = (void **)malloc(800);
  vBitCuts->pArray = ppvVar2;
  uVar7 = -(p->nObjs[5] + p->nObjs[6]);
  pVVar4 = p->vObjs;
  if (pVVar4->nSize < 1) {
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    lVar5 = 0;
    uVar8 = 0;
    uVar6 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar4->pArray[lVar5];
      if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
        Ivy_NodeFindCutsTravAll(p_00,pObj,4,(int)in_RCX,vNodes,vFront,vStore,vBitCuts);
        uVar7 = uVar7 + Ivy_NodeFindCutsTravAll::CutStore.nCuts;
        uVar8 = uVar8 + (Ivy_NodeFindCutsTravAll::CutStore.nCuts == 0x100);
        uVar6 = uVar6 + 1;
      }
      lVar5 = lVar5 + 1;
      pVVar4 = p->vObjs;
      in_RCX = (long)pVVar4->nSize;
    } while (lVar5 < in_RCX);
  }
  iVar1 = 0x938b72;
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)uVar7,
         (ulong)(uint)(p->nObjs[5] + p->nObjs[1] + p->nObjs[6]),(ulong)uVar6,(ulong)uVar8);
  Abc_Print(iVar1,"%s =","Time");
  level = 3;
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + local_48) / 1000000.0);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vFront->pArray != (void **)0x0) {
    free(vFront->pArray);
    vFront->pArray = (void **)0x0;
  }
  free(vFront);
  if (vStore->pArray != (int *)0x0) {
    free(vStore->pArray);
    vStore->pArray = (int *)0x0;
  }
  free(vStore);
  iVar1 = vBitCuts->nSize;
  if (0 < (long)iVar1) {
    ppvVar2 = vBitCuts->pArray;
    lVar5 = 0;
    do {
      __ptr = ppvVar2[lVar5];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (vBitCuts->pArray != (void **)0x0) {
    free(vBitCuts->pArray);
    vBitCuts->pArray = (void **)0x0;
  }
  free(vBitCuts);
  return;
}

Assistant:

void Ivy_ManTestCutsTravAll( Ivy_Man_t * p )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    Vec_Ptr_t * vNodes, * vFront;
    Vec_Int_t * vStore;
    Vec_Vec_t * vBitCuts;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();

    vNodes = Vec_PtrAlloc( 100 );
    vFront = Vec_PtrAlloc( 100 );
    vStore = Vec_IntAlloc( 100 );
    vBitCuts = Vec_VecAlloc( 100 );

    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_NodeFindCutsTravAll( p, pObj, 4, 60, vNodes, vFront, vStore, vBitCuts );
        nCutsCut    = pStore->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );

    Vec_PtrFree( vNodes );
    Vec_PtrFree( vFront );
    Vec_IntFree( vStore );
    Vec_VecFree( vBitCuts );

}